

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_tail_fixup(ASMState *as,TraceNo lnk)

{
  ushort uVar1;
  MCode *pMVar2;
  char cVar3;
  MCode MVar4;
  uint uVar5;
  MCode MVar6;
  int iVar7;
  int local_58;
  MCode *p1;
  int32_t spadj;
  MCode *q;
  MCode *target;
  MCode *p;
  TraceNo lnk_local;
  ASMState *as_local;
  ptrdiff_t delta;
  
  pMVar2 = as->mctop;
  uVar1 = as->T->spadjust;
  uVar5 = (uint)uVar1;
  if (uVar5 == 0) {
    iVar7 = 6;
    if ((as->flags & 0x800) != 0) {
      iVar7 = 7;
    }
    p = pMVar2 + -(long)(iVar7 + 1);
  }
  else {
    MVar6 = (MCode)uVar1;
    if (uVar5 == (int)(char)MVar6) {
      pMVar2[-9] = MVar6;
      p = pMVar2 + -3;
    }
    else {
      *(uint *)(pMVar2 + -9) = uVar5;
      p = pMVar2;
    }
    if ((as->flags & 0x800) == 0) {
      pMVar2[-0xc] = 'H';
      MVar4 = 0x81;
      if (uVar5 == (int)(char)MVar6) {
        MVar4 = 0x83;
      }
      pMVar2[-0xb] = MVar4;
      pMVar2[-10] = 0xc4;
    }
    else {
      pMVar2[-0xd] = 'H';
      pMVar2[-0xc] = 0x8d;
      cVar3 = -0x80;
      if (uVar5 == (int)(char)MVar6) {
        cVar3 = '@';
      }
      pMVar2[-0xb] = cVar3 + '$';
      pMVar2[-10] = '$';
    }
  }
  if (lnk == 0) {
    local_58 = 0x1a149b;
  }
  else {
    local_58 = (int)*(undefined8 *)((ulong)as->J->trace[lnk].gcptr32 + 0x40);
  }
  *(int *)(p + -4) = local_58 - (int)p;
  p[-5] = 0xe9;
  q = as->mctop;
  while (q = q + -1, p <= q) {
    *q = 0x90;
  }
  as->mctop = p;
  return;
}

Assistant:

static void asm_tail_fixup(ASMState *as, TraceNo lnk)
{
  /* Note: don't use as->mcp swap + emit_*: emit_op overwrites more bytes. */
  MCode *p = as->mctop;
  MCode *target, *q;
  int32_t spadj = as->T->spadjust;
  if (spadj == 0) {
    p -= ((as->flags & JIT_F_LEA_AGU) ? 7 : 6) + (LJ_64 ? 1 : 0);
  } else {
    MCode *p1;
    /* Patch stack adjustment. */
    if (checki8(spadj)) {
      p -= 3;
      p1 = p-6;
      *p1 = (MCode)spadj;
    } else {
      p1 = p-9;
      *(int32_t *)p1 = spadj;
    }
    if ((as->flags & JIT_F_LEA_AGU)) {
#if LJ_64
      p1[-4] = 0x48;
#endif
      p1[-3] = (MCode)XI_LEA;
      p1[-2] = MODRM(checki8(spadj) ? XM_OFS8 : XM_OFS32, RID_ESP, RID_ESP);
      p1[-1] = MODRM(XM_SCALE1, RID_ESP, RID_ESP);
    } else {
#if LJ_64
      p1[-3] = 0x48;
#endif
      p1[-2] = (MCode)(checki8(spadj) ? XI_ARITHi8 : XI_ARITHi);
      p1[-1] = MODRM(XM_REG, XOg_ADD, RID_ESP);
    }
  }
  /* Patch exit branch. */
  target = lnk ? traceref(as->J, lnk)->mcode : (MCode *)lj_vm_exit_interp;
  *(int32_t *)(p-4) = jmprel(p, target);
  p[-5] = XI_JMP;
  /* Drop unused mcode tail. Fill with NOPs to make the prefetcher happy. */
  for (q = as->mctop-1; q >= p; q--)
    *q = XI_NOP;
  as->mctop = p;
}